

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_windows.cpp
# Opt level: O0

Am_Drawonable *
Am_Drawonable_Impl::Create_Drawonable_From_XWindow
          (Window created_drawable,Display *created_display,
          Am_External_Event_Handler *ext_ev_handler,char *tit,char *icon_tit,bool vis,
          bool initially_iconified,Am_Style *back_color,bool save_under_flag,int min_w,int min_h,
          int max_w,int max_h,bool title_bar_flag,bool query_user_for_position,
          bool query_user_for_size,bool clip_by_children_flag,Am_Input_Event_Handlers *evh)

{
  Screen_Desc *the_screen;
  byte bVar1;
  byte bVar2;
  char *icon_tit_00;
  char *tit_00;
  int iVar3;
  ostream *poVar4;
  void *this;
  Am_Drawonable_Impl *pAVar5;
  Am_Style local_148;
  unsigned_long local_140;
  unsigned_long attrib_value_mask;
  XSetWindowAttributes attrib;
  Am_Style local_b8;
  Am_Drawonable_Impl *local_b0;
  Am_Drawonable_Impl *d;
  uint bit_depth;
  uint border_w;
  uint h;
  uint w;
  int t;
  int l;
  Window dummy_root;
  Am_Drawonable_Impl *parent;
  long lStack_78;
  uint nc;
  Window *c;
  Window r;
  Window p;
  bool clip_by_children_flag_local;
  bool query_user_for_size_local;
  bool query_user_for_position_local;
  bool title_bar_flag_local;
  bool save_under_flag_local;
  bool initially_iconified_local;
  char *pcStack_58;
  bool vis_local;
  char *icon_tit_local;
  char *tit_local;
  Am_External_Event_Handler *ext_ev_handler_local;
  Display *created_display_local;
  Window created_drawable_local;
  
  p._6_1_ = initially_iconified;
  p._5_1_ = save_under_flag;
  p._4_1_ = title_bar_flag;
  p._3_1_ = query_user_for_position;
  p._2_1_ = query_user_for_size;
  p._1_1_ = clip_by_children_flag;
  p._7_1_ = vis;
  pcStack_58 = icon_tit;
  icon_tit_local = tit;
  tit_local = (char *)ext_ev_handler;
  ext_ev_handler_local = (Am_External_Event_Handler *)created_display;
  created_display_local = (Display *)created_drawable;
  XQueryTree(created_display,created_drawable,&c,&r,&stack0xffffffffffffff88,(long)&parent + 4);
  if (lStack_78 != 0) {
    XFree(lStack_78);
  }
  dummy_root = (Window)Get_Drawable_Backpointer((Display *)ext_ev_handler_local,r);
  if (((Am_Drawonable_Impl *)dummy_root == (Am_Drawonable_Impl *)0x0) &&
     (dummy_root = (Window)Screen_Manager::Member(&Scrn_Mgr,(Display *)ext_ev_handler_local),
     (Am_Drawonable *)dummy_root == (Am_Drawonable *)0x0)) {
    dummy_root = (Window)make_root_drawonable((char *)0x0,(Display *)ext_ev_handler_local);
    poVar4 = std::operator<<((ostream *)&std::cerr,"** Warning, Can\'t find parent for display ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,ext_ev_handler_local);
    poVar4 = std::operator<<(poVar4," so created new one ");
    poVar4 = ::operator<<(poVar4,(Am_Drawonable *)dummy_root);
    this = (void *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(this,std::flush<char,std::char_traits<char>>);
  }
  iVar3 = XGetGeometry(ext_ev_handler_local,created_display_local,&t,&w,&h,&border_w);
  if (iVar3 != 0) {
    pAVar5 = (Am_Drawonable_Impl *)operator_new(0xa8);
    tit_00 = icon_tit_local;
    icon_tit_00 = pcStack_58;
    bVar2 = p._7_1_;
    bVar1 = p._6_1_;
    attrib.cursor._3_1_ = 1;
    Am_Style::Am_Style(&local_b8,back_color);
    Am_Drawonable_Impl(pAVar5,w,h,border_w,bit_depth,tit_00,icon_tit_00,(bool)(bVar2 & 1),
                       (bool)(bVar1 & 1),&local_b8,(bool)(p._5_1_ & 1),min_w,min_h,max_w,max_h,
                       (bool)(p._4_1_ & 1),(bool)(p._1_1_ & 1),
                       *(uint *)(*(long *)(dummy_root + 0x70) + 0x38),evh);
    attrib.cursor._3_1_ = 0;
    Am_Style::~Am_Style(&local_b8);
    pAVar5->owner = (Am_Drawonable *)dummy_root;
    pAVar5->screen = *(Screen_Desc **)(dummy_root + 0x70);
    pAVar5->ext_handler = (Am_External_Event_Handler *)tit_local;
    local_b0 = pAVar5;
    Screen_Desc::Note_Reference(*(Screen_Desc **)(dummy_root + 0x70));
    Initialize_Event_Mask(local_b0);
    pAVar5 = local_b0;
    the_screen = local_b0->screen;
    Am_Style::Am_Style(&local_148,back_color);
    install_attributes((XSetWindowAttributes *)&attrib_value_mask,&local_140,pAVar5,the_screen,
                       &local_148,(bool)(p._5_1_ & 1),(bool)(p._4_1_ & 1),
                       local_b0->current_event_mask);
    Am_Style::~Am_Style(&local_148);
    local_b0->xlib_drawable = (Window)created_display_local;
    XChangeWindowAttributes(ext_ev_handler_local,created_display_local,local_140,&attrib_value_mask)
    ;
    Set_Drawable_Backpointer((Display *)ext_ev_handler_local,(Window)created_display_local,local_b0)
    ;
    set_other_window_properties
              (local_b0->xlib_drawable,local_b0->screen->display,icon_tit_local,pcStack_58,
               (bool)(p._6_1_ & 1),min_w,min_h,max_w,max_h,(bool)(p._3_1_ & 1),(bool)(p._2_1_ & 1));
    return &local_b0->super_Am_Drawonable;
  }
  Am_Error("** Can\'t get window geometry.\n");
}

Assistant:

Am_Drawonable *
Am_Drawonable_Impl::Create_Drawonable_From_XWindow(
    Window created_drawable, Display *created_display,
    Am_External_Event_Handler *ext_ev_handler, const char *tit,
    const char *icon_tit, bool vis, bool initially_iconified,
    Am_Style back_color, bool save_under_flag, int min_w, int min_h, int max_w,
    int max_h, bool title_bar_flag, bool query_user_for_position,
    bool query_user_for_size, bool clip_by_children_flag,
    Am_Input_Event_Handlers *evh)
{

  Window p, r;
  Window *c;
  unsigned int nc;
  XQueryTree(created_display, created_drawable, &r, &p, &c, &nc);
  if (c)
    XFree(c);

  Am_Drawonable_Impl *parent = Get_Drawable_Backpointer(created_display, p);
  if (!parent) {
    parent = (Am_Drawonable_Impl *)Scrn_Mgr.Member(created_display);
    if (!parent) {
      parent =
          (Am_Drawonable_Impl *)make_root_drawonable(nullptr, created_display);
      std::cerr << "** Warning, Can't find parent for display "
                << created_display << " so created new one " << parent
                << std::endl
                << std::flush;
    }
  }

  Window dummy_root;
  int l, t;
  unsigned int w, h;
  unsigned int border_w;
  unsigned int bit_depth;
  if (!XGetGeometry(created_display, created_drawable, &dummy_root, &l, &t, &w,
                    &h, &border_w, &bit_depth))
    Am_Error("** Can't get window geometry.\n");

  Am_Drawonable_Impl *d = new /* Am_External_Drawonable_Impl */
      Am_Drawonable_Impl(l, t, w, h, tit, icon_tit, vis, initially_iconified,
                         back_color, save_under_flag, min_w, min_h, max_w,
                         max_h, title_bar_flag, clip_by_children_flag,
                         parent->screen->depth, evh);

  d->owner = parent;
  d->screen = parent->screen;
  d->ext_handler = ext_ev_handler;

  parent->screen->Note_Reference();

  // initialize for event handling
  d->Initialize_Event_Mask(); // must come before call to generate_attrib

  // Create window attribute struct and value-mask for attribute fields
  //
  XSetWindowAttributes attrib;
  unsigned long attrib_value_mask;
  install_attributes(&attrib, &attrib_value_mask, d, d->screen, back_color,
                     save_under_flag, title_bar_flag, d->current_event_mask);

  d->xlib_drawable = created_drawable;

  XChangeWindowAttributes(created_display, created_drawable, attrib_value_mask,
                          &attrib);
  Set_Drawable_Backpointer(created_display, created_drawable, d);

  set_other_window_properties(
      d->xlib_drawable, d->screen->display, tit, icon_tit, initially_iconified,
      min_w, min_h, max_w, max_h, query_user_for_position, query_user_for_size);
  return d;
}